

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

_Bool square_reveal_trap(chunk *c,loc grid,_Bool always,_Bool domsg)

{
  bitflag *flags;
  _Bool _Var1;
  _Bool _Var2;
  trap *ptVar3;
  int local_48;
  
  ptVar3 = square_trap((chunk_conflict *)c,grid);
  _Var1 = square_isplayertrap((chunk_conflict *)c,grid);
  _Var2 = false;
  if (ptVar3 != (trap *)0x0 && _Var1) {
    local_48 = 0;
    do {
      flags = ptVar3->flags;
      _Var1 = flag_has_dbg(flags,3,2,"trap->flags","TRF_TRAP");
      if ((_Var1) && ((always || ((int)(uint)ptVar3->power <= (player->state).skills[4])))) {
        _Var1 = flag_has_dbg(flags,3,3,"trap->flags","TRF_VISIBLE");
        if (!_Var1) {
          flag_on_dbg(flags,3,3,"trap->flags","TRF_VISIBLE");
          square_memorize_traps(c,grid);
          local_48 = local_48 + 1;
        }
      }
      ptVar3 = ptVar3->next;
    } while (ptVar3 != (trap *)0x0);
    if (local_48 == 0) {
      _Var2 = false;
    }
    else {
      if (domsg) {
        if (local_48 == 1) {
          msg("You have found a trap.");
        }
        else {
          msg("You have found %d traps.");
        }
      }
      square_memorize((chunk_conflict *)c,grid);
      square_light_spot(c,grid);
      _Var2 = true;
    }
  }
  return _Var2;
}

Assistant:

bool square_reveal_trap(struct chunk *c, struct loc grid, bool always,
						bool domsg)
{
    int found_trap = 0;
	struct trap *trap = square_trap(c, grid);
    
    /* Check there is a player trap */
    if (!square_isplayertrap(c, grid))
		return false;

	/* Scan the grid */
	while (trap) {
		/* Skip non-player traps */
		if (!trf_has(trap->flags, TRF_TRAP)) {
			trap = trap->next;
			continue;
		}
		
		/* Skip traps the player doesn't notice */
		if (!always && player->state.skills[SKILL_SEARCH] < trap->power) {
			trap = trap->next;
			continue;
		}

		/* Trap is invisible */
		if (!trf_has(trap->flags, TRF_VISIBLE)) {
			/* See the trap (actually, see all the traps) */
			trf_on(trap->flags, TRF_VISIBLE);
			square_memorize_traps(c, grid);

			/* We found a trap */
			found_trap++;
		}
		trap = trap->next;
	}

    /* We found at least one trap */
    if (found_trap) {
		/* We want to talk about it */
		if (domsg) {
			if (found_trap == 1)
				msg("You have found a trap.");
			else
				msg("You have found %d traps.", found_trap);
		}

		/* Memorize */
		square_memorize(c, grid);

		/* Redraw */
		square_light_spot(c, grid);
    }

    /* Return true if we found any traps */
    return (found_trap != 0);
}